

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

UINT8 __thiscall
PlayerA::SetOutputSettings
          (PlayerA *this,UINT32 smplRate,UINT8 channels,UINT8 smplBits,UINT32 smplBufferLen)

{
  PLR_SMPL_PACK p_Var1;
  UINT8 UVar2;
  uint uVar3;
  byte bVar4;
  undefined7 in_register_00000011;
  
  UVar2 = 0xf0;
  if ((int)CONCAT71(in_register_00000011,channels) == 2) {
    bVar4 = smplBits * ' ' | (byte)(smplBits - 8) >> 3;
    UVar2 = 0xf1;
    if (bVar4 < 4) {
      p_Var1 = (PLR_SMPL_PACK)(&PTR_SampleConv_toU8_001921f0)[bVar4];
      this->_outSmplChns = '\x02';
      this->_outSmplBits = smplBits;
      this->_outSmplPack = p_Var1;
      SetSampleRate(this,smplRate);
      uVar3 = (uint)(this->_outSmplBits >> 3);
      this->_outSmplSize1 = uVar3;
      this->_outSmplSizeA = this->_outSmplChns * uVar3;
      std::vector<_waveform_32bit_stereo,_std::allocator<_waveform_32bit_stereo>_>::resize
                (&this->_smplBuf,(ulong)smplBufferLen);
      UVar2 = '\0';
    }
  }
  return UVar2;
}

Assistant:

UINT8 PlayerA::SetOutputSettings(UINT32 smplRate, UINT8 channels, UINT8 smplBits, UINT32 smplBufferLen)
{
	if (channels != 2)
		return 0xF0;	// TODO: support channels = 1
	PLR_SMPL_PACK smplPackFunc = GetSampleConvFunc(smplBits);
	if (smplPackFunc == NULL)
		return 0xF1;	// unsupported sample format
	
	_outSmplChns = channels;
	_outSmplBits = smplBits;
	_outSmplPack = smplPackFunc;
	SetSampleRate(smplRate);
	_outSmplSize1 = _outSmplBits / 8;
	_outSmplSizeA = _outSmplSize1 * _outSmplChns;
	_smplBuf.resize(smplBufferLen);
	return 0x00;
}